

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall DLevelScript::PutLast(DLevelScript *this)

{
  DLevelScript *pDVar1;
  DACSThinker *pDVar2;
  
  pDVar2 = GC::ReadBarrier<DACSThinker>((DACSThinker **)&DACSThinker::ActiveThinker);
  if (pDVar2->LastScript != this) {
    Unlink(this);
    if (pDVar2->Scripts == (DLevelScript *)0x0) {
      Link(this);
      return;
    }
    pDVar1 = pDVar2->LastScript;
    if (pDVar1 != (DLevelScript *)0x0) {
      pDVar1->next = this;
    }
    this->prev = pDVar1;
    this->next = (DLevelScript *)0x0;
    pDVar2->LastScript = this;
  }
  return;
}

Assistant:

void DLevelScript::PutLast ()
{
	DACSThinker *controller = DACSThinker::ActiveThinker;

	if (controller->LastScript == this)
		return;

	Unlink ();
	if (controller->Scripts == NULL)
	{
		Link ();
	}
	else
	{
		if (controller->LastScript)
			controller->LastScript->next = this;
		prev = controller->LastScript;
		next = NULL;
		controller->LastScript = this;
	}
}